

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::deleteAll<std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
               (vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_> *container
               )

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  ppIVar1 = (container->
            super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (container->
                 super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (IGeneratorInfo *)0x0) {
      (*(*ppIVar2)->_vptr_IGeneratorInfo[1])();
    }
  }
  return;
}

Assistant:

Generic::AllOf<ExpressionT> Matcher<ExpressionT>::operator && ( Matcher<ExpressionT> const& other ) const {
        Generic::AllOf<ExpressionT> allOfExpr;
        allOfExpr.add( *this );
        allOfExpr.add( other );
        return allOfExpr;
    }